

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.2.13.10.hpp
# Opt level: O3

iterator * __thiscall Catch::clara::TextFlow::Columns::iterator::operator++(iterator *this)

{
  iterator *this_00;
  pointer piVar1;
  vector<Catch::clara::TextFlow::Column,_std::allocator<Catch::clara::TextFlow::Column>_> *pvVar2;
  pointer pCVar3;
  ulong uVar4;
  long lVar5;
  
  pvVar2 = this->m_columns;
  pCVar3 = (pvVar2->
           super__Vector_base<Catch::clara::TextFlow::Column,_std::allocator<Catch::clara::TextFlow::Column>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if ((pvVar2->
      super__Vector_base<Catch::clara::TextFlow::Column,_std::allocator<Catch::clara::TextFlow::Column>_>
      )._M_impl.super__Vector_impl_data._M_finish != pCVar3) {
    lVar5 = 0;
    uVar4 = 0;
    do {
      piVar1 = (this->m_iterators).
               super__Vector_base<Catch::clara::TextFlow::Column::iterator,_std::allocator<Catch::clara::TextFlow::Column::iterator>_>
               ._M_impl.super__Vector_impl_data._M_start;
      this_00 = (iterator *)((long)&piVar1->m_column + lVar5);
      if (((*(long *)((long)&piVar1->m_pos + lVar5) != 0) ||
          (*(long *)((long)&piVar1->m_stringIndex + lVar5) !=
           *(long *)((long)&(pCVar3->m_strings).
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish + lVar5) -
           *(long *)((long)&(pCVar3->m_strings).
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start + lVar5) >> 5)) ||
         ((Column *)
          ((long)&(pCVar3->m_strings).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start + lVar5) != this_00->m_column)) {
        Column::iterator::operator++(this_00);
        pvVar2 = this->m_columns;
        pCVar3 = (pvVar2->
                 super__Vector_base<Catch::clara::TextFlow::Column,_std::allocator<Catch::clara::TextFlow::Column>_>
                 )._M_impl.super__Vector_impl_data._M_start;
      }
      uVar4 = uVar4 + 1;
      lVar5 = lVar5 + 0x30;
    } while (uVar4 < (ulong)(((long)(pvVar2->
                                    super__Vector_base<Catch::clara::TextFlow::Column,_std::allocator<Catch::clara::TextFlow::Column>_>
                                    )._M_impl.super__Vector_impl_data._M_finish - (long)pCVar3 >> 4)
                            * -0x5555555555555555));
  }
  return this;
}

Assistant:

auto operator ++() -> iterator& {
			for (size_t i = 0; i < m_columns.size(); ++i) {
				if (m_iterators[i] != m_columns[i].end())
					++m_iterators[i];
			}
			return *this;
		}